

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLDST3Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t in_ESI;
  uint size;
  uint load;
  uint align;
  undefined4 local_38;
  undefined4 local_4;
  
  uVar1 = fieldFromInstruction_4(in_ESI,6,2);
  if (uVar1 == 3) {
    local_4 = MCDisassembler_Fail;
  }
  else {
    uVar1 = fieldFromInstruction_4(in_ESI,4,2);
    if ((uVar1 & 2) == 0) {
      uVar1 = fieldFromInstruction_4(in_ESI,0x15,1);
      if (uVar1 == 0) {
        local_38 = DecodeVSTInstruction(Inst,Insn,Address,Decoder);
      }
      else {
        local_38 = DecodeVLDInstruction(Inst,Insn,Address,Decoder);
      }
      local_4 = local_38;
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeVLDST3Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned align, load;
	unsigned size = fieldFromInstruction_4(Insn, 6, 2);
	if (size == 3) return MCDisassembler_Fail;

	align = fieldFromInstruction_4(Insn, 4, 2);
	if (align & 2) return MCDisassembler_Fail;

	load = fieldFromInstruction_4(Insn, 21, 1);
	return load ? DecodeVLDInstruction(Inst, Insn, Address, Decoder)
		: DecodeVSTInstruction(Inst, Insn, Address, Decoder);
}